

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_identity(lysp_yin_ctx *ctx,lysp_ident **identities)

{
  lysp_ident *plVar1;
  long lVar2;
  lysp_ext_instance *object;
  LY_ERR LVar3;
  long *plVar4;
  lysp_ext_instance **exts;
  yin_subelement subelems [6];
  yin_subelement local_b8;
  undefined4 local_a0;
  long *local_98;
  undefined2 local_90;
  undefined4 local_88;
  long *local_80;
  undefined2 local_78;
  undefined4 local_70;
  long *local_68;
  undefined2 local_60;
  undefined4 local_58;
  long *local_50;
  undefined2 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  plVar1 = *identities;
  if (plVar1 == (lysp_ident *)0x0) {
    plVar4 = (long *)malloc(0x40);
    if (plVar4 != (long *)0x0) {
      *plVar4 = 1;
      goto LAB_00189561;
    }
  }
  else {
    lVar2 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar2 + 1;
    plVar4 = (long *)realloc(&plVar1[-1].flags,lVar2 * 0x38 + 0x40);
    if (plVar4 != (long *)0x0) {
LAB_00189561:
      *identities = (lysp_ident *)(plVar4 + 1);
      lVar2 = *plVar4;
      plVar4[lVar2 * 7 + -2] = 0;
      (plVar4 + lVar2 * 7 + -2)[1] = 0;
      plVar4[lVar2 * 7 + -4] = 0;
      (plVar4 + lVar2 * 7 + -4)[1] = 0;
      plVar4[lVar2 * 7 + -6] = 0;
      (plVar4 + lVar2 * 7 + -6)[1] = 0;
      plVar4[lVar2 * 7] = 0;
      LVar3 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar3 != LY_SUCCESS) {
        return LVar3 + (LVar3 == LY_SUCCESS);
      }
      LVar3 = yin_parse_attribute(ctx,YIN_ARG_NAME,(char **)(plVar4 + lVar2 * 7 + -6),Y_IDENTIF_ARG,
                                  LY_STMT_IDENTITY);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      local_50 = plVar4 + lVar2 * 7;
      local_b8.type = LY_STMT_BASE;
      local_b8.dest = local_50 + -4;
      local_b8.flags = 0;
      local_a0 = 0x80000;
      local_98 = local_50 + -3;
      local_90 = 2;
      local_88 = 0x130000;
      local_80 = local_50 + -5;
      local_78 = 8;
      local_70 = 0x270000;
      local_68 = local_50 + -2;
      local_60 = 2;
      local_58 = 0x2c0000;
      local_48 = 2;
      uStack_38 = 0;
      local_30 = 0;
      local_40 = 0xf0000;
      exts = (lysp_ext_instance **)(local_50 + -1);
      LVar3 = yin_parse_content(ctx,&local_b8,6,plVar4 + lVar2 * 7 + -6,LY_STMT_IDENTITY,
                                (char **)0x0,exts);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      object = *exts;
      if (object == (lysp_ext_instance *)0x0) {
        return LY_SUCCESS;
      }
      LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
      return LVar3;
    }
    *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + -1;
  }
  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_identity");
  return LY_EMEM;
}

Assistant:

static LY_ERR
yin_parse_identity(struct lysp_yin_ctx *ctx, struct lysp_ident **identities)
{
    struct lysp_ident *ident;

    /* allocate new identity */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *identities, ident, LY_EMEM);

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &ident->name, Y_IDENTIF_ARG, LY_STMT_IDENTITY));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_BASE, &ident->bases, 0},
        {LY_STMT_DESCRIPTION, &ident->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &ident->iffeatures, YIN_SUBELEM_VER2},
        {LY_STMT_REFERENCE, &ident->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &ident->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), ident, LY_STMT_IDENTITY, NULL, &ident->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, ident->exts));

    return LY_SUCCESS;
}